

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O3

SmallBuffer * __thiscall
helics::CustomTranslatorOperator::convertToValue
          (SmallBuffer *__return_storage_ptr__,CustomTranslatorOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  _Head_base<0UL,_helics::Message_*,_false> local_10;
  
  if (*(long *)&this->field_0x20 == 0) {
    (__return_storage_ptr__->buffer)._M_elems[0x30] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x31] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x32] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x33] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x34] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x35] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x36] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x37] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x38] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x39] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x3a] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x3b] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x3c] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x3d] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x3e] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x3f] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x20] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x21] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x22] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x23] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x24] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x25] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x26] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x27] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x28] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x29] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x2a] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x2b] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x2c] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x2d] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x2e] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x2f] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x10] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x11] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x12] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x13] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x14] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x15] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x16] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x17] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x18] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x19] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x1a] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x1b] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x1c] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x1d] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x1e] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0x1f] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0] = 0;
    (__return_storage_ptr__->buffer)._M_elems[1] = 0;
    (__return_storage_ptr__->buffer)._M_elems[2] = 0;
    (__return_storage_ptr__->buffer)._M_elems[3] = 0;
    (__return_storage_ptr__->buffer)._M_elems[4] = 0;
    (__return_storage_ptr__->buffer)._M_elems[5] = 0;
    (__return_storage_ptr__->buffer)._M_elems[6] = 0;
    (__return_storage_ptr__->buffer)._M_elems[7] = 0;
    (__return_storage_ptr__->buffer)._M_elems[8] = 0;
    (__return_storage_ptr__->buffer)._M_elems[9] = 0;
    (__return_storage_ptr__->buffer)._M_elems[10] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0xb] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0xc] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0xd] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0xe] = 0;
    (__return_storage_ptr__->buffer)._M_elems[0xf] = 0;
    __return_storage_ptr__->bufferSize = 0;
    __return_storage_ptr__->bufferCapacity = 0x40;
    __return_storage_ptr__->heap = (byte *)__return_storage_ptr__;
    __return_storage_ptr__->nonOwning = false;
    __return_storage_ptr__->locked = false;
    __return_storage_ptr__->usingAllocatedBuffer = false;
    __return_storage_ptr__->errorCondition = '\0';
    __return_storage_ptr__->userKey = 0;
  }
  else {
    local_10._M_head_impl =
         (message->_M_t).
         super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
    (message->_M_t).super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
    _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
    if (*(long *)&this->field_0x20 == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)&this->field_0x28)(__return_storage_ptr__,&this->toValueFunction,&local_10);
    if (local_10._M_head_impl != (Message *)0x0) {
      std::default_delete<helics::Message>::operator()
                ((default_delete<helics::Message> *)&local_10,local_10._M_head_impl);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer CustomTranslatorOperator::convertToValue(std::unique_ptr<Message> message)
{
    if (toValueFunction) {
        return toValueFunction(std::move(message));
    }
    return {};
}